

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_inst.c
# Opt level: O0

void if_op(vm *v,instruction *inst)

{
  func_type bt_00;
  func_type bt_01;
  _Bool _Var1;
  undefined1 auStack_40 [7];
  _Bool if_true;
  func_type bt;
  ifArgs *ia;
  instruction *inst_local;
  vm *v_local;
  
  bt.return_types = (byte *)inst->arg;
  get_block_type((func_type *)auStack_40,v,*(int32 *)bt.return_types);
  _Var1 = popBool(&v->operandStack);
  if (_Var1) {
    bt_00.param_types = (byte *)bt._0_8_;
    bt_00.param_count = auStack_40._0_4_;
    bt_00._4_4_ = stack0xffffffffffffffc4;
    bt_00._16_8_ = bt.param_types;
    bt_00.return_types = (byte *)bt._16_8_;
    enterBlock(v,'\x04',bt_00,(vec *)(bt.return_types + 8));
  }
  else {
    bt_01.param_types = (byte *)bt._0_8_;
    bt_01.param_count = auStack_40._0_4_;
    bt_01._4_4_ = stack0xffffffffffffffc4;
    bt_01._16_8_ = bt.param_types;
    bt_01.return_types = (byte *)bt._16_8_;
    enterBlock(v,'\x04',bt_01,(vec *)(bt.return_types + 0x58));
  }
  return;
}

Assistant:

void if_op(vm *v, instruction *inst) {
    ifArgs *ia = (ifArgs *) inst->arg;
    func_type bt = get_block_type(v, ia->blockType);
    bool if_true = popBool(&v->operandStack);
    if (if_true) {
        enterBlock(v, If, bt, &ia->instructions1);
    } else {
        enterBlock(v, If, bt, &ia->instructions2);
    }
}